

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O0

void FSE_initDState(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD,FSE_DTable *dt)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  FSE_DTableHeader *DTableH;
  void *ptr;
  FSE_DTable *dt_local;
  BIT_DStream_t *bitD_local;
  FSE_DState_t *DStatePtr_local;
  size_t value;
  U32 regMask;
  
  uVar1 = (ushort)*dt;
  uVar2 = bitD->bitsConsumed;
  uVar3 = BIT_mask[(uint)uVar1];
  bitD->bitsConsumed = (uint)uVar1 + bitD->bitsConsumed;
  DStatePtr->state =
       bitD->bitContainer >> (('@' - (char)uVar2) - (char)uVar1 & 0x3fU) & (ulong)uVar3;
  BIT_reloadDStream(bitD);
  DStatePtr->table = dt + 1;
  return;
}

Assistant:

MEM_STATIC void FSE_initDState(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD, const FSE_DTable* dt)
{
    const void* ptr = dt;
    const FSE_DTableHeader* const DTableH = (const FSE_DTableHeader*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}